

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

void int_rel_reif_real(IntVar *x,IntRelType t,int c,BoolView *r)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  IntVar *pIVar7;
  undefined8 extraout_RAX;
  BoolView *pBVar8;
  BoolView *pBVar9;
  int iVar10;
  int extraout_EDX;
  BoolView *pBVar11;
  BoolView *y;
  IntRelType t_00;
  BoolRelType t_01;
  long lVar13;
  bool bVar14;
  int in_stack_fffffffffffffd34;
  Lit LStack_2c4;
  vec<Lit> vStack_2c0;
  vec<Lit> vStack_2b0;
  BoolView BStack_298;
  BoolView BStack_288;
  BoolView BStack_278;
  BoolView BStack_268;
  BoolView BStack_258;
  BoolView BStack_248;
  BoolView BStack_238;
  BoolView BStack_228;
  BoolView BStack_218;
  BoolView BStack_208;
  BoolView BStack_1f8;
  BoolView BStack_1e8;
  BoolView BStack_1d8;
  BoolView BStack_1c8;
  BoolView BStack_1b8;
  BoolView BStack_1a8;
  BoolView BStack_198;
  BoolView BStack_188;
  BoolView *pBStack_178;
  long lStack_170;
  Var in_stack_fffffffffffffeb8;
  bool local_13c [4];
  BoolView local_138;
  BoolView local_128;
  BoolView local_118;
  BoolView local_108;
  BoolView local_f8;
  BoolView local_e8;
  BoolView local_d8;
  BoolView local_c8;
  BoolView local_b8;
  BoolView local_a8;
  BoolView local_98;
  BoolView local_88;
  BoolView local_78;
  BoolView local_68;
  BoolView local_58;
  BoolView local_48;
  BoolView local_38;
  long lVar12;
  
  iVar4 = in_stack_fffffffffffffeb8.super_Branching._vptr_Branching._4_4_;
  pBVar9 = (BoolView *)&stack0xfffffffffffffeb8;
  pBVar8 = r;
  if (((t == IRT_NE) &&
      (pBVar8 = (BoolView *)(ulong)((uint)r->s * 2),
      (uint)r->s * -2 + 1 == (int)sat.assigns.data[(uint)r->v])) &&
     (iVar3 = (*(x->super_Var).super_Branching._vptr_Branching[3])(x), iVar3 == 2)) {
    if (c < (x->min).v) {
      return;
    }
    if ((x->max).v < c) {
      return;
    }
    if ((x->vals != (Tchar *)0x0) && (x->vals[c].v == '\0')) {
      return;
    }
    iVar4 = (*(x->super_Var).super_Branching._vptr_Branching[0x11])(x,(long)c,0,1);
    if ((char)iVar4 != '\0') {
      return;
    }
    puts("=====UNSATISFIABLE=====");
    printf("%% Top level failure!\n");
    exit(0);
  }
  iVar3 = (*(x->super_Var).super_Branching._vptr_Branching[3])(x);
  if (iVar3 == 1) {
    pIVar7 = getConstant(iVar4);
    int_rel_reif(x,t,pIVar7,r,0);
    return;
  }
  lVar13 = (long)c;
  iVar4 = (*(x->super_Var).super_Branching._vptr_Branching[0xd])(x,lVar13,2);
  lVar12 = lVar13;
  iVar3 = (*(x->super_Var).super_Branching._vptr_Branching[0xd])(x,lVar13,3);
  t_00 = (IntRelType)lVar12;
  if (IRT_GT < t) {
    int_rel_reif_real();
    if ((uint)pBVar8->s * 2 + -1 == (int)sat.assigns.data[(uint)pBVar8->v]) {
      return;
    }
    pBStack_178 = r;
    lStack_170 = lVar13;
    if (((t_00 == IRT_NE) && ((uint)pBVar8->s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar8->v]))
       && (iVar4 = (*(x->super_Var).super_Branching._vptr_Branching[3])(x), iVar4 == 2)) {
      if (extraout_EDX < (x->min).v) {
        return;
      }
      if ((x->max).v < extraout_EDX) {
        return;
      }
      if ((x->vals != (Tchar *)0x0) && (x->vals[extraout_EDX].v == '\0')) {
        return;
      }
      iVar4 = (*(x->super_Var).super_Branching._vptr_Branching[0x11])(x,(long)extraout_EDX,0,1);
      if ((char)iVar4 != '\0') {
        return;
      }
      puts("=====UNSATISFIABLE=====");
      printf("%% Top level failure!\n");
      exit(0);
    }
    iVar4 = (*(x->super_Var).super_Branching._vptr_Branching[3])(x);
    if (iVar4 == 1) {
      pIVar7 = getConstant(in_stack_fffffffffffffd34);
      int_rel_half_reif(x,t_00,pIVar7,pBVar8,0);
      return;
    }
    uVar5 = (*(x->super_Var).super_Branching._vptr_Branching[0xd])(x,(long)extraout_EDX,2);
    uVar6 = (*(x->super_Var).super_Branching._vptr_Branching[0xd])(x,(long)extraout_EDX,3);
    if (IRT_GT < t_00) {
      int_rel_half_reif_real();
      if (vStack_2c0.data != (Lit *)0x0) {
        free(vStack_2c0.data);
      }
      if (vStack_2b0.data != (Lit *)0x0) {
        free(vStack_2b0.data);
      }
      _Unwind_Resume(extraout_RAX);
    }
    iVar3 = (int)uVar5 >> 1;
    bVar14 = (bool)((byte)uVar5 & 1);
    iVar4 = (int)uVar6 >> 1;
    bVar2 = (bool)((byte)uVar6 & 1);
    switch(t_00) {
    case IRT_EQ:
      BStack_188.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_198.v = pBVar8->v;
      BStack_198.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_198.s = (bool)(pBVar8->s ^ 1);
      BStack_1a8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_1a8.v = bv_true.v;
      BStack_1a8.s = bv_true.s;
      BStack_188.v = iVar4;
      BStack_188.s = bVar2;
      bool_rel(&BStack_188,BRT_OR,&BStack_198,&BStack_1a8);
      pBVar11 = &BStack_1b8;
      BStack_1b8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_1c8.v = pBVar8->v;
      y = &BStack_1c8;
      BStack_1c8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_1c8.s = (bool)(pBVar8->s ^ 1);
      pBVar9 = &BStack_1d8;
      BStack_1d8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_1b8.v = iVar3;
      BStack_1b8.s = bVar14;
      goto LAB_001b146d;
    case IRT_NE:
      vStack_2b0.sz = 0;
      vStack_2b0.cap = 0;
      vStack_2b0.data = (Lit *)0x0;
      vStack_2c0.sz = (uint)(bVar14 ^ 1) | uVar5 & 0xfffffffe;
      vec<Lit>::push(&vStack_2b0,(Lit *)&vStack_2c0);
      vStack_2c0.sz = (uint)(bVar2 ^ 1) | uVar6 & 0xfffffffe;
      vec<Lit>::push(&vStack_2b0,(Lit *)&vStack_2c0);
      vStack_2c0.sz = (pBVar8->s ^ 1) + pBVar8->v * 2;
      vec<Lit>::push(&vStack_2b0,(Lit *)&vStack_2c0);
      SAT::addClause(&sat,&vStack_2b0,false);
      vStack_2c0.sz = 0;
      vStack_2c0.cap = 0;
      vStack_2c0.data = (Lit *)0x0;
      LStack_2c4.x = uVar5;
      vec<Lit>::push(&vStack_2c0,&LStack_2c4);
      LStack_2c4.x = uVar6;
      vec<Lit>::push(&vStack_2c0,&LStack_2c4);
      LStack_2c4.x = (pBVar8->s ^ 1) + pBVar8->v * 2;
      vec<Lit>::push(&vStack_2c0,&LStack_2c4);
      SAT::addClause(&sat,&vStack_2c0,false);
      if (vStack_2c0.data != (Lit *)0x0) {
        free(vStack_2c0.data);
      }
      if (vStack_2b0.data == (Lit *)0x0) {
        return;
      }
      free(vStack_2b0.data);
      return;
    case IRT_LE:
      pBVar11 = &BStack_1e8;
      BStack_1e8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_1f8.v = pBVar8->v;
      y = &BStack_1f8;
      BStack_1f8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_1f8.s = (bool)(pBVar8->s ^ 1);
      pBVar9 = &BStack_208;
      BStack_1e8.v = iVar4;
      BStack_1e8.s = bVar2;
      break;
    case IRT_LT:
      pBVar11 = &BStack_218;
      BStack_218.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_218.s = (bool)(bVar14 ^ 1);
      BStack_228.v = pBVar8->v;
      y = &BStack_228;
      BStack_228.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_228.s = (bool)(pBVar8->s ^ 1);
      pBVar9 = &BStack_238;
      BStack_218.v = iVar3;
      goto LAB_001b131e;
    case IRT_GE:
      pBVar11 = &BStack_248;
      BStack_248.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_258.v = pBVar8->v;
      y = &BStack_258;
      BStack_258.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_258.s = (bool)(pBVar8->s ^ 1);
      pBVar9 = &BStack_268;
      BStack_248.v = iVar3;
      BStack_248.s = bVar14;
LAB_001b131e:
      (pBVar9->super_Var).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020bb98;
      goto LAB_001b146d;
    case IRT_GT:
      pBVar11 = &BStack_278;
      BStack_278.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_278.s = (bool)(bVar2 ^ 1);
      BStack_288.v = pBVar8->v;
      y = &BStack_288;
      BStack_288.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      BStack_288.s = (bool)(pBVar8->s ^ 1);
      pBVar9 = &BStack_298;
      BStack_278.v = iVar4;
    }
    (pBVar9->super_Var).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020bb98;
LAB_001b146d:
    pBVar9->v = bv_true.v;
    pBVar9->s = bv_true.s;
    bool_rel(pBVar11,BRT_OR,y,pBVar9);
    return;
  }
  piVar1 = &r->v;
  iVar10 = iVar4 >> 1;
  bVar14 = (bool)((byte)iVar4 & 1);
  iVar4 = iVar3 >> 1;
  bVar2 = (bool)((byte)iVar3 & 1);
  switch(t) {
  case IRT_EQ:
    pBVar8 = &local_38;
    local_38.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    pBVar11 = &local_48;
    local_48.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    pBVar9 = &local_58;
    local_58.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_58.v = *piVar1;
    local_58.s = r->s;
    local_48.v = iVar4;
    local_48.s = bVar2;
    local_38.v = iVar10;
    local_38.s = bVar14;
    goto LAB_001b0fe2;
  case IRT_NE:
    pBVar8 = &local_68;
    local_68.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    pBVar11 = &local_78;
    local_78.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_88.v = r->v;
    pBVar9 = &local_88;
    local_88.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_88.s = (bool)(r->s ^ 1);
    local_78.v = iVar4;
    local_78.s = bVar2;
    local_68.v = iVar10;
    local_68.s = bVar14;
LAB_001b0fe2:
    t_01 = BRT_AND;
    goto LAB_001b1036;
  case IRT_LE:
    pBVar8 = &local_98;
    local_98.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    pBVar11 = &local_a8;
    local_a8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_a8.v = *piVar1;
    local_a8.s = r->s;
    pBVar9 = &local_b8;
    local_b8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_98.v = iVar4;
    local_98.s = bVar2;
    break;
  case IRT_LT:
    pBVar8 = &local_c8;
    local_c8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_d8.v = r->v;
    pBVar11 = &local_d8;
    local_d8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_d8.s = (bool)(r->s ^ 1);
    pBVar9 = &local_e8;
    local_c8.v = iVar10;
    local_c8.s = bVar14;
    goto LAB_001b0f8f;
  case IRT_GE:
    pBVar8 = &local_f8;
    local_f8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    pBVar11 = &local_108;
    local_108.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_108.v = *piVar1;
    local_108.s = r->s;
    pBVar9 = &local_118;
    local_f8.v = iVar10;
    local_f8.s = bVar14;
LAB_001b0f8f:
    (pBVar9->super_Var).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020bb98;
    break;
  case IRT_GT:
    pBVar8 = &local_128;
    local_128.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_138.v = r->v;
    pBVar11 = &local_138;
    local_138.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_138.s = (bool)(r->s ^ 1);
    local_128.v = iVar4;
    local_128.s = bVar2;
  }
  pBVar9->v = bv_true.v;
  pBVar9->s = bv_true.s;
  t_01 = BRT_EQ;
LAB_001b1036:
  bool_rel(pBVar8,t_01,pBVar11,pBVar9);
  return;
}

Assistant:

void int_rel_reif_real(IntVar* x, IntRelType t, int c, BoolView r) {
	if (r.isTrue() && t == IRT_NE && x->getType() == INT_VAR_EL) {
		TL_SET(x, remVal, c);
		return;
	}
	if (x->getType() == INT_VAR) {
		assert(!so.lazy);
		IntVar* v = getConstant(c);
		int_rel_reif(x, t, v, r);
		return;
	}
	const BoolView b1(x->getLit(c, LR_GE));
	const BoolView b2(x->getLit(c, LR_LE));
	switch (t) {
		case IRT_EQ:
			bool_rel(b1, BRT_AND, b2, r);
			break;
		case IRT_NE:
			bool_rel(b1, BRT_AND, b2, ~r);
			break;
		case IRT_LE:
			bool_rel(b2, BRT_EQ, r);
			break;
		case IRT_LT:
			bool_rel(b1, BRT_EQ, ~r);
			break;
		case IRT_GE:
			bool_rel(b1, BRT_EQ, r);
			break;
		case IRT_GT:
			bool_rel(b2, BRT_EQ, ~r);
			break;
		default:
			NEVER;
	}
}